

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.cpp
# Opt level: O1

Error __thiscall
asmjit::FuncArgsAssignment::updateFuncFrame(FuncArgsAssignment *this,FuncFrame *frame)

{
  Error EVar1;
  RAConstraints constraints;
  FuncArgsContext ctx;
  
  if (this->_funcDetail == (FuncDetail *)0x0) {
    EVar1 = 3;
  }
  else {
    constraints._availableRegs[0] = 0;
    constraints._availableRegs[1] = 0;
    constraints._availableRegs[2] = 0;
    constraints._availableRegs[3] = 0;
    EVar1 = RAConstraints::init(&constraints,(EVP_PKEY_CTX *)(ulong)frame->_arch);
    if (EVar1 == 0) {
      FuncArgsContext::FuncArgsContext(&ctx);
      EVar1 = FuncArgsContext::initWorkData(&ctx,frame,this,&constraints);
      if (((EVar1 == 0) && (EVar1 = FuncArgsContext::markDstRegsDirty(&ctx,frame), EVar1 == 0)) &&
         (EVar1 = FuncArgsContext::markScratchRegs(&ctx,frame), EVar1 == 0)) {
        EVar1 = FuncArgsContext::markStackArgsReg(&ctx,frame);
      }
    }
  }
  return EVar1;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FuncArgsAssignment::updateFuncFrame(FuncFrame& frame) const noexcept {
  uint32_t arch = frame.arch();
  const FuncDetail* func = funcDetail();

  if (!func)
    return DebugUtils::errored(kErrorInvalidState);

  RAConstraints constraints;
  ASMJIT_PROPAGATE(constraints.init(arch));

  FuncArgsContext ctx;
  ASMJIT_PROPAGATE(ctx.initWorkData(frame, *this, &constraints));
  ASMJIT_PROPAGATE(ctx.markDstRegsDirty(frame));
  ASMJIT_PROPAGATE(ctx.markScratchRegs(frame));
  ASMJIT_PROPAGATE(ctx.markStackArgsReg(frame));
  return kErrorOk;
}